

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseDelphiCoverage.cxx
# Opt level: O0

bool __thiscall cmParseDelphiCoverage::HTMLParser::ParseFile(HTMLParser *this,char *file)

{
  cmCTest *pcVar1;
  cmCTestCoverageHandlerContainer *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  void *this_00;
  char *pcVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  const_reference pvVar9;
  mapped_type *coverageVector_00;
  reference pvVar10;
  string local_8e0 [32];
  string local_8c0 [32];
  long local_8a0;
  ifstream in;
  FileLinesType *coverageVector;
  undefined1 local_670 [8];
  ostringstream cmCTestLog_msg_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  undefined1 local_4d0 [8];
  string glob;
  Glob gl;
  undefined1 local_438 [8];
  ostringstream cmCTestLog_msg_1;
  string local_2c0 [36];
  undefined4 local_29c;
  string local_298 [32];
  ostringstream local_278 [8];
  ostringstream cmCTestLog_msg;
  size_t pos;
  size_t endnamepos;
  size_t endcovpos;
  size_t lastoffset;
  size_t afterLineNum;
  string filelineoffset;
  string filename;
  string lastroutine;
  string lineresult;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string line;
  char *file_local;
  HTMLParser *this_local;
  
  line.field_2._8_8_ = file;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,file,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::string((string *)(lastroutine.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(filelineoffset.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&afterLineNum);
  pos = 0;
  do {
    lVar6 = std::__cxx11::string::find((char)local_40,0x28);
    if (lVar6 == -1) {
      std::__cxx11::ostringstream::ostringstream(local_278);
      poVar7 = (ostream *)std::ostream::operator<<(local_278,pos);
      poVar7 = std::operator<<(poVar7,"File not found  ");
      this_00 = (void *)std::ostream::operator<<(poVar7,0xffffffffffffffff);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseDelphiCoverage.cxx"
                   ,0x72,pcVar8,(bool)(this->Coverage->Quiet & 1));
      std::__cxx11::string::~string(local_298);
      std::__cxx11::ostringstream::~ostringstream(local_278);
      this_local._7_1_ = false;
      local_29c = 1;
      goto LAB_001b6541;
    }
    pos = std::__cxx11::string::find((char)local_40,0x29);
    std::__cxx11::string::substr((ulong)local_2c0,(ulong)local_40);
    std::__cxx11::string::operator=((string *)(filelineoffset.field_2._M_local_buf + 8),local_2c0);
    std::__cxx11::string::~string(local_2c0);
    lVar6 = std::__cxx11::string::find(filelineoffset.field_2._M_local_buf + 8,0x9204f3);
  } while (lVar6 == -1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  poVar7 = std::operator<<((ostream *)local_438,"Coverage found for file:  ");
  poVar7 = std::operator<<(poVar7,(string *)(filelineoffset.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseDelphiCoverage.cxx"
               ,0x7b,pcVar8,(bool)(this->Coverage->Quiet & 1));
  std::__cxx11::string::~string((string *)&gl.ListDirs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  cmsys::Glob::Glob((Glob *)((long)&glob.field_2 + 8));
  cmsys::Glob::RecurseOn((Glob *)((long)&glob.field_2 + 8));
  cmsys::Glob::RecurseThroughSymlinksOff((Glob *)((long)&glob.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&files,
                 &this->Coverage->SourceDir,"*/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&files,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filelineoffset.field_2 + 8));
  std::__cxx11::string::~string((string *)&files);
  cmsys::Glob::FindFiles((Glob *)((long)&glob.field_2 + 8),(string *)local_4d0,(GlobMessages *)0x0);
  this_01 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&glob.field_2 + 8));
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_01);
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
    poVar7 = std::operator<<((ostream *)local_670,"Unable to find file matching");
    poVar7 = std::operator<<(poVar7,(string *)local_4d0);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseDelphiCoverage.cxx"
                 ,0x91,pcVar8,(bool)(this->Coverage->Quiet & 1));
    std::__cxx11::string::~string((string *)&coverageVector);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
    this_local._7_1_ = false;
    local_29c = 1;
  }
  else {
    pcVar2 = this->Coverage;
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this_01,0);
    coverageVector_00 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::operator[](&pcVar2->TotalCoverage,pvVar9);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this_01,0);
    initializeDelphiFile(this,pvVar9,coverageVector_00);
    std::ifstream::ifstream(&local_8a0,(char *)line.field_2._8_8_,_S_in);
    bVar4 = std::ios::operator!((ios *)((long)&local_8a0 + *(long *)(local_8a0 + -0x18)));
    if ((bVar4 & 1) == 0) {
      while (bVar3 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&local_8a0,(string *)local_40,(bool *)0x0,-1), bVar3) {
        lVar6 = std::__cxx11::string::find(local_40,0x920530);
        if (lVar6 != -1) {
          std::__cxx11::string::find(local_40,0x920537);
          std::__cxx11::string::find((char)local_40,0x3e);
          std::__cxx11::string::substr((ulong)local_8c0,(ulong)local_40);
          std::__cxx11::string::operator=
                    ((string *)(lastroutine.field_2._M_local_buf + 8),local_8c0);
          std::__cxx11::string::~string(local_8c0);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(lastroutine.field_2._M_local_buf + 8),"covered");
          if (bVar3) {
            std::__cxx11::string::find((char)local_40,0x3c);
            std::__cxx11::string::substr((ulong)local_8e0,(ulong)local_40);
            std::__cxx11::string::operator=((string *)&afterLineNum,local_8e0);
            std::__cxx11::string::~string(local_8e0);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            iVar5 = atoi(pcVar8);
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (coverageVector_00,(long)(iVar5 + -1));
            *pvVar10 = 1;
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    local_29c = 1;
    std::ifstream::~ifstream(&local_8a0);
  }
  std::__cxx11::string::~string((string *)local_4d0);
  cmsys::Glob::~Glob((Glob *)((long)&glob.field_2 + 8));
LAB_001b6541:
  std::__cxx11::string::~string((string *)&afterLineNum);
  std::__cxx11::string::~string((string *)(filelineoffset.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(lastroutine.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool ParseFile(const char* file)
  {
    std::string line = file;
    std::string lineresult;
    std::string lastroutine;
    std::string filename;
    std::string filelineoffset;
    size_t afterLineNum = 0;
    size_t lastoffset = 0;
    size_t endcovpos = 0;
    size_t endnamepos = 0;
    size_t pos = 0;

    /*
     *  This first 'while' section goes through the found HTML
     *  file name and attempts to capture the source file name
     *   which is set as part of the HTML file name: the name of
     *   the file is found in parenthesis '()'
     *
     *   See test HTML file name: UTCovTest(UTCovTest.pas).html.
     *
     *   Find the text inside each pair of parenthesis and check
     *   to see if it ends in '.pas'.  If it can't be found,
     *   exit the function.
     */
    while (true) {
      lastoffset = line.find('(', pos);
      if (lastoffset == std::string::npos) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           endnamepos << "File not found  " << lastoffset
                                      << std::endl,
                           this->Coverage.Quiet);
        return false;
      }
      endnamepos = line.find(')', lastoffset);
      filename = line.substr(lastoffset + 1, (endnamepos - 1) - lastoffset);
      if (filename.find(".pas") != std::string::npos) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Coverage found for file:  " << filename
                                                        << std::endl,
                           this->Coverage.Quiet);
        break;
      }
      pos = lastoffset + 1;
    }
    /*
     *  Glob through the source directory for the
     *  file found above
     */
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.RecurseThroughSymlinksOff();
    std::string glob = Coverage.SourceDir + "*/" + filename;
    gl.FindFiles(glob);
    std::vector<std::string> const& files = gl.GetFiles();
    if (files.empty()) {
      /*
       *  If that doesn't find any matching files
       *  return a failure.
       */
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Unable to find file matching" << glob << std::endl,
                         this->Coverage.Quiet);
      return false;
    }
    FileLinesType& coverageVector = this->Coverage.TotalCoverage[files[0]];

    /*
     *  Initialize the file to have all code between 'begin' and
     *  'end' tags marked as executable
     */

    this->initializeDelphiFile(files[0], coverageVector);

    cmsys::ifstream in(file);
    if (!in) {
      return false;
    }

    /*
     *  Now read the HTML file, looking for the lines that have an
     *  "inline" in it. Then parse out the "class" value of that
     *  line to determine if the line is executed or not.
     *
     *  Sample HTML line:
     *
     *  <tr class="covered"><td>47</td><td><pre style="display:inline;">
     *    &nbsp;CheckEquals(1,2-1);</pre></td></tr>
     *
     */

    while (cmSystemTools::GetLineFromStream(in, line)) {
      if (line.find("inline") == std::string::npos) {
        continue;
      }

      lastoffset = line.find("class=");
      endcovpos = line.find('>', lastoffset);
      lineresult = line.substr(lastoffset + 7, (endcovpos - 8) - lastoffset);

      if (lineresult == "covered") {
        afterLineNum = line.find('<', endcovpos + 5);
        filelineoffset =
          line.substr(endcovpos + 5, afterLineNum - (endcovpos + 5));
        coverageVector[atoi(filelineoffset.c_str()) - 1] = 1;
      }
    }
    return true;
  }